

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  __int_type_conflict1 _Var1;
  byte bVar2;
  fdb_kvs_handle *handle;
  fdb_file_handle *pfVar3;
  fdb_kvs_id_t fVar4;
  hbtrie *phVar5;
  btreeblk_handle *pbVar6;
  filemgr *pfVar7;
  size_t chunksize;
  undefined8 uVar8;
  fdb_log_levels given_log_level;
  long lVar9;
  fdb_log_callback_ex p_Var10;
  bid_t bVar11;
  char *rawkey;
  bool bVar12;
  fdb_status status;
  hbtrie_result hVar13;
  int rawkeylen;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *buf;
  fdb_kvs_handle *pfVar20;
  fdb_kvs_handle *handle_00;
  size_t sStack_1a0;
  char *pcStack_190;
  char acStack_188 [8];
  undefined1 local_180 [8];
  fdb_config config;
  fdb_kvs_config kvs_config;
  undefined1 local_68 [4];
  uint sleep_time;
  bid_t id_root;
  bid_t seq_root;
  bid_t dummy;
  char *local_48;
  fdb_kvs_handle *local_40;
  fdb_file_handle *local_38;
  
  buf = acStack_188;
  status = FDB_RESULT_INVALID_HANDLE;
  if ((handle_ptr != (fdb_kvs_handle **)0x0) &&
     (handle = *handle_ptr, handle != (fdb_kvs_handle *)0x0)) {
    if (handle->kvs == (kvs_info *)0x0) {
      status = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pfVar20 = handle->kvs->root;
      pfVar3 = handle->fhandle;
      pcStack_190 = (char *)0x12e9c9;
      memcpy(local_180,&handle->config,0xf8);
      kvs_config.custom_cmp = (fdb_custom_cmp_variable)(handle->kvs_config).custom_cmp_param;
      config.num_blocks_readahead = *(uint32_t *)&handle->kvs_config;
      config.bottom_up_index_build = (bool)(handle->kvs_config).field_0x4;
      config._245_3_ = *(undefined3 *)&(handle->kvs_config).field_0x5;
      kvs_config._0_4_ = *(undefined4 *)&(handle->kvs_config).custom_cmp;
      kvs_config._4_4_ = *(undefined4 *)((long)&(handle->kvs_config).custom_cmp + 4);
      if (((handle->config).flags & 2) == 0) {
        pcStack_190 = (char *)0x12e9ea;
        filemgr_mutex_lock(handle->file);
        pcStack_190 = (char *)0x12e9f6;
        filemgr_set_rollback(handle->file,'\x01');
        pcStack_190 = (char *)0x12e9ff;
        bVar12 = wal_txn_exists(handle->file);
        if (bVar12) {
          pcStack_190 = (char *)0x12ea0e;
          filemgr_set_rollback(handle->file,'\0');
          pcStack_190 = (char *)0x12ea17;
          filemgr_mutex_unlock(handle->file);
          status = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          kvs_config.custom_cmp_param._4_4_ = 10000;
          dummy = (bid_t)pfVar20;
          local_38 = pfVar3;
          while( true ) {
            _Var1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
            pcStack_190 = (char *)0x12ea98;
            filemgr_mutex_unlock(handle->file);
            if (_Var1 != '\x01') break;
            pcStack_190 = (char *)0x12eaab;
            decaying_usleep((uint *)((long)&kvs_config.custom_cmp_param + 4),1000000);
            pcStack_190 = (char *)0x12eab4;
            filemgr_mutex_lock(handle->file);
          }
          if (_Var1 == '\x04') {
            pcStack_190 = (char *)0x12eac9;
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          pcStack_190 = (char *)0x12ead1;
          fdb_sync_db_header(handle);
          pfVar3 = local_38;
          bVar11 = dummy;
          if (handle->seqnum < seqnum) {
            pcStack_190 = (char *)0x12eaee;
            filemgr_set_rollback(*(filemgr **)(dummy + 0x48),'\0');
            status = FDB_RESULT_NO_DB_INSTANCE;
          }
          else {
            pcStack_190 = (char *)0x12eb01;
            local_48 = _fdb_kvs_get_name(handle,handle->file);
            if (seqnum == 0) {
              pcStack_190 = (char *)0x12eb92;
              status = _fdb_kvs_remove(pfVar3,local_48,true);
              pcStack_190 = (char *)0x12eba1;
              filemgr_set_rollback(*(filemgr **)(bVar11 + 0x48),'\0');
            }
            else {
              pcStack_190 = (char *)0x12eb17;
              local_40 = (fdb_kvs_handle *)calloc(1,0x208);
              if (local_40 == (fdb_kvs_handle *)0x0) {
                pcStack_190 = (char *)0x12ebb1;
                filemgr_set_rollback(handle->file,'\0');
                status = FDB_RESULT_ALLOC_FAIL;
              }
              else {
                local_40->max_seqnum = seqnum;
                p_Var10 = (handle->log_callback).callback_ex;
                (local_40->log_callback).callback = (handle->log_callback).callback;
                (local_40->log_callback).callback_ex = p_Var10;
                (local_40->log_callback).ctx_data = (handle->log_callback).ctx_data;
                local_40->fhandle = pfVar3;
                LOCK();
                (local_40->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                UNLOCK();
                if (handle->kvs->type == '\x01') {
                  sStack_1a0 = 0x12eb80;
                  status = _fdb_kvs_open(handle->kvs->root,(fdb_config *)local_180,
                                         (fdb_kvs_config *)&config.num_blocks_readahead,handle->file
                                         ,handle->file->filename,local_48,local_40);
                }
                else {
                  pcStack_190 = (char *)0x12ebd1;
                  status = _fdb_open(local_40,handle->file->filename,FDB_AFILENAME,
                                     (fdb_config *)local_180);
                }
                pcStack_190 = (char *)0x12ebdf;
                filemgr_set_rollback(handle->file,'\0');
                pfVar20 = local_40;
                if (status == FDB_RESULT_SUCCESS) {
                  bVar2 = local_40->trie->chunksize;
                  pcStack_190 = (char *)0x12ec02;
                  filemgr_mutex_lock(handle->file);
                  pfVar20 = local_40;
                  lVar9 = -(ulong)(bVar2 + 0xf & 0xfffffff0);
                  buf = acStack_188 + lVar9;
                  fVar4 = local_40->kvs->id;
                  pcVar14 = acStack_188 + lVar9 + -8;
                  local_38 = (fdb_file_handle *)(ulong)bVar2;
                  pcVar14[0] = '-';
                  pcVar14[1] = -0x14;
                  pcVar14[2] = '\x12';
                  pcVar14[3] = '\0';
                  pcVar14[4] = '\0';
                  pcVar14[5] = '\0';
                  pcVar14[6] = '\0';
                  pcVar14[7] = '\0';
                  kvid2buf((ulong)bVar2,fVar4,buf);
                  pfVar3 = local_38;
                  phVar5 = pfVar20->trie;
                  pcVar15 = acStack_188 + lVar9 + -8;
                  local_48 = buf;
                  pcVar15[0] = 'E';
                  pcVar15[1] = -0x14;
                  pcVar15[2] = '\x12';
                  pcVar15[3] = '\0';
                  pcVar15[4] = '\0';
                  pcVar15[5] = '\0';
                  pcVar15[6] = '\0';
                  pcVar15[7] = '\0';
                  hVar13 = hbtrie_find_partial(phVar5,buf,(int)pfVar3,local_68);
                  pbVar6 = pfVar20->bhandle;
                  pcVar16 = acStack_188 + lVar9 + -8;
                  pcVar16[0] = 'Q';
                  pcVar16[1] = -0x14;
                  pcVar16[2] = '\x12';
                  pcVar16[3] = '\0';
                  pcVar16[4] = '\0';
                  pcVar16[5] = '\0';
                  pcVar16[6] = '\0';
                  pcVar16[7] = '\0';
                  btreeblk_end(pbVar6);
                  rawkey = local_48;
                  phVar5 = *(hbtrie **)(dummy + 0x30);
                  rawkeylen = (int)local_38;
                  if (hVar13 == HBTRIE_RESULT_SUCCESS) {
                    pcVar18 = acStack_188 + lVar9 + -8;
                    pcVar18[0] = -0x7e;
                    pcVar18[1] = -0x14;
                    pcVar18[2] = '\x12';
                    pcVar18[3] = '\0';
                    pcVar18[4] = '\0';
                    pcVar18[5] = '\0';
                    pcVar18[6] = '\0';
                    pcVar18[7] = '\0';
                    hbtrie_insert_partial(phVar5,rawkey,rawkeylen,local_68,&seq_root);
                  }
                  else {
                    pcVar17 = acStack_188 + lVar9 + -8;
                    pcVar17[0] = 'k';
                    pcVar17[1] = -0x14;
                    pcVar17[2] = '\x12';
                    pcVar17[3] = '\0';
                    pcVar17[4] = '\0';
                    pcVar17[5] = '\0';
                    pcVar17[6] = '\0';
                    pcVar17[7] = '\0';
                    hbtrie_remove_partial(phVar5,rawkey,rawkeylen);
                  }
                  handle_00 = (fdb_kvs_handle *)dummy;
                  pbVar6 = *(btreeblk_handle **)(dummy + 0x58);
                  pcVar19 = acStack_188 + lVar9 + -8;
                  pcVar19[0] = -0x70;
                  pcVar19[1] = -0x14;
                  pcVar19[2] = '\x12';
                  pcVar19[3] = '\0';
                  pcVar19[4] = '\0';
                  pcVar19[5] = '\0';
                  pcVar19[6] = '\0';
                  pcVar19[7] = '\0';
                  btreeblk_end(pbVar6);
                  if (config.wal_flush_before_commit == true) {
                    buf = &stack0xfffffffffffffe68 + lVar9;
                    fVar4 = local_40->kvs->id;
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 8;
                    chunksize = *(size_t *)((long)&sStack_1a0 + lVar9);
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ecc1;
                    kvid2buf(chunksize,fVar4,buf);
                    phVar5 = (local_40->field_6).seqtrie;
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 8;
                    uVar8 = *(undefined8 *)((long)&sStack_1a0 + lVar9);
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ecd8;
                    hVar13 = hbtrie_find_partial(phVar5,buf,(int)uVar8,&id_root);
                    local_38 = (fdb_file_handle *)CONCAT44(local_38._4_4_,hVar13);
                    pbVar6 = local_40->bhandle;
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ece8;
                    btreeblk_end(pbVar6);
                    phVar5 = *(hbtrie **)((long)handle_00 + 0x40);
                    if ((int)local_38 == 0) {
                      *(undefined8 *)((long)&sStack_1a0 + lVar9) = 8;
                      uVar8 = *(undefined8 *)((long)&sStack_1a0 + lVar9);
                      *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ed13;
                      hbtrie_insert_partial(phVar5,buf,(int)uVar8,&id_root,&seq_root);
                    }
                    else {
                      *(undefined8 *)((long)&sStack_1a0 + lVar9) = 8;
                      uVar8 = *(undefined8 *)((long)&sStack_1a0 + lVar9);
                      *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ecfe;
                      hbtrie_remove_partial(phVar5,buf,(int)uVar8);
                    }
                    handle_00 = (fdb_kvs_handle *)dummy;
                    pbVar6 = *(btreeblk_handle **)(dummy + 0x58);
                    *(undefined8 *)((long)&sStack_1a0 + lVar9) = 0x12ed21;
                    btreeblk_end(pbVar6);
                  }
                  pfVar20 = local_40;
                  pfVar7 = handle->file;
                  fVar4 = handle->kvs->id;
                  buf[-8] = '6';
                  buf[-7] = -0x13;
                  buf[-6] = '\x12';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  local_38 = (fdb_file_handle *)fdb_kvs_get_seqnum(pfVar7,fVar4);
                  pfVar7 = handle->file;
                  fVar4 = handle->kvs->id;
                  buf[-8] = 'N';
                  buf[-7] = -0x13;
                  buf[-6] = '\x12';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  fdb_kvs_set_seqnum(pfVar7,fVar4,seqnum);
                  handle->seqnum = seqnum;
                  pfVar7 = handle->file;
                  buf[-8] = '^';
                  buf[-7] = -0x13;
                  buf[-6] = '\x12';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  filemgr_mutex_unlock(pfVar7);
                  handle_00->rollback_revnum = pfVar20->rollback_revnum;
                  bVar2 = (handle->config).durability_opt;
                  buf[-8] = '\x01';
                  buf[-7] = '\0';
                  buf[-6] = '\0';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  uVar8 = *(undefined8 *)(buf + -8);
                  buf[-8] = -0x7c;
                  buf[-7] = -0x13;
                  buf[-6] = '\x12';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  status = _fdb_commit(handle_00,(fdb_commit_opt_t)uVar8,(bVar2 & 2) == 0);
                  if (status == FDB_RESULT_SUCCESS) {
                    buf[-8] = -4;
                    buf[-7] = -0x13;
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    _fdb_kvs_close(pfVar20);
                    *handle_ptr = handle;
                  }
                  else {
                    buf[-8] = '\x02';
                    buf[-7] = '\0';
                    buf[-6] = '\0';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    given_log_level = *(fdb_log_levels *)(buf + -8);
                    *(fdb_seqnum_t *)(buf + -8) = seqnum;
                    *(char **)(buf + -0x10) =
                         "Rollback failed due to a commit failure with a sequence number %lu";
                    buf[-0x18] = -0x3f;
                    buf[-0x17] = -0x13;
                    buf[-0x16] = '\x12';
                    buf[-0x15] = '\0';
                    buf[-0x14] = '\0';
                    buf[-0x13] = '\0';
                    buf[-0x12] = '\0';
                    buf[-0x11] = '\0';
                    fdb_log_impl(&handle->log_callback,given_log_level,status,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                                 ,"fdb_kvs_rollback",0x921,*(char **)(buf + -0x10));
                    pfVar7 = handle->file;
                    buf[-8] = -0x34;
                    buf[-7] = -0x13;
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    filemgr_mutex_lock(pfVar7);
                    pfVar3 = local_38;
                    pfVar7 = handle->file;
                    fVar4 = handle->kvs->id;
                    buf[-8] = -0x1f;
                    buf[-7] = -0x13;
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    fdb_kvs_set_seqnum(pfVar7,fVar4,(fdb_seqnum_t)pfVar3);
                    pfVar7 = handle->file;
                    buf[-8] = -0x16;
                    buf[-7] = -0x13;
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    filemgr_mutex_unlock(pfVar7);
                    buf[-8] = -0xe;
                    buf[-7] = -0x13;
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    _fdb_kvs_close(pfVar20);
                  }
                  buf[-8] = '\a';
                  buf[-7] = -0x12;
                  buf[-6] = '\x12';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  fdb_kvs_info_free(pfVar20);
                }
                *(undefined8 *)(buf + -8) = 0x12ee0f;
                free(pfVar20);
              }
            }
          }
        }
      }
      else {
        pcStack_190 = handle->file->filename;
        sStack_1a0 = 0x12ea6c;
        status = fdb_log_impl(&handle->log_callback,2,FDB_RESULT_RONLY_VIOLATION,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                              ,"fdb_kvs_rollback",0x895,
                              "Warning: Rollback is not allowed on the read-only DB file \'%s\'.");
      }
    }
  }
  return status;
}

Assistant:

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_handle *handle_in, *handle, *super_handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;
    fdb_file_handle *fhandle;
    char *kvs_name;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle_in->kvs) {
        return FDB_RESULT_INVALID_ARGS;
    }
    super_handle = handle_in->kvs->root;
    fhandle = handle_in->fhandle;
    config = handle_in->config;
    kvs_config = handle_in->kvs_config;

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on "
                       "the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    kvs_name = _fdb_kvs_get_name(handle_in, handle_in->file);
    if (seqnum == 0) { // Handle special case of rollback to zero..
        fs = _fdb_kvs_remove(fhandle, kvs_name, true /*recreate!*/);
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return fs;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle->max_seqnum = seqnum;
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = fhandle;
    atomic_init_uint8_t(&handle->handle_busy, 0);

    if (handle_in->kvs->type == KVS_SUB) {
        fs = _fdb_kvs_open(handle_in->kvs->root,
                           &config,
                           &kvs_config,
                           handle_in->file,
                           handle_in->file->filename,
                           kvs_name,
                           handle);
    } else {
        fs = _fdb_open(handle, handle_in->file->filename,
                       FDB_AFILENAME, &config);
    }
    filemgr_set_rollback(handle_in->file, 0); // allow mutations

    if (fs == FDB_RESULT_SUCCESS) {
        // get KV instance's sub B+trees' root node BIDs
        // from both ID-tree and Seq-tree, AND
        // replace current handle's sub B+trees' root node BIDs
        // by old BIDs
        size_t size_chunk, size_id;
        bid_t id_root, seq_root, dummy;
        uint8_t *_kv_id;
        hbtrie_result hr;

        size_chunk = handle->trie->chunksize;
        size_id = sizeof(fdb_kvs_id_t);

        filemgr_mutex_lock(handle_in->file);

        // read root BID of the KV instance from the old handle
        // and overwrite into the current handle
        _kv_id = alca(uint8_t, size_chunk);
        kvid2buf(size_chunk, handle->kvs->id, _kv_id);
        hr = hbtrie_find_partial(handle->trie, _kv_id,
                                 size_chunk, &id_root);
        btreeblk_end(handle->bhandle);
        if (hr == HBTRIE_RESULT_SUCCESS) {
            hbtrie_insert_partial(super_handle->trie,
                                  _kv_id, size_chunk,
                                  &id_root, &dummy);
        } else { // No Trie info in rollback header.
                 // Erase kv store from super handle's main index.
            hbtrie_remove_partial(super_handle->trie, _kv_id, size_chunk);
        }
        btreeblk_end(super_handle->bhandle);

        if (config.seqtree_opt == FDB_SEQTREE_USE) {
            // same as above for seq-trie
            _kv_id = alca(uint8_t, size_id);
            kvid2buf(size_id, handle->kvs->id, _kv_id);
            hr = hbtrie_find_partial(handle->seqtrie, _kv_id,
                                     size_id, &seq_root);
            btreeblk_end(handle->bhandle);
            if (hr == HBTRIE_RESULT_SUCCESS) {
                hbtrie_insert_partial(super_handle->seqtrie,
                                      _kv_id, size_id,
                                      &seq_root, &dummy);
            } else { // No seqtrie info in rollback header.
                     // Erase kv store from super handle's seqtrie index.
                hbtrie_remove_partial(super_handle->seqtrie, _kv_id, size_id);
            }
            btreeblk_end(super_handle->bhandle);
        }

        old_seqnum = fdb_kvs_get_seqnum(handle_in->file,
                                        handle_in->kvs->id);
        fdb_kvs_set_seqnum(handle_in->file,
                           handle_in->kvs->id, seqnum);
        handle_in->seqnum = seqnum;
        filemgr_mutex_unlock(handle_in->file);

        super_handle->rollback_revnum = handle->rollback_revnum;
        fs = _fdb_commit(super_handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                         !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_kvs_close(handle);
            *handle_ptr = handle_in;
            fdb_kvs_info_free(handle);
            free(handle);
        } else {
            // cancel the rolling-back of the sequence number
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Rollback failed due to a commit failure with a sequence "
                    "number %" _F64, seqnum);
            filemgr_mutex_lock(handle_in->file);
            fdb_kvs_set_seqnum(handle_in->file,
                               handle_in->kvs->id, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            _fdb_kvs_close(handle);
            fdb_kvs_info_free(handle);
            free(handle);
        }
    } else {
        free(handle);
    }

    return fs;
}